

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  nk_plugin_alloc p_Var1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  nk_font *pnVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  nk_font_config *pnVar12;
  ushort *puVar13;
  ushort *puVar14;
  uchar *puVar15;
  byte bVar16;
  long lStack_a0;
  nk_font_config local_88;
  
  bVar16 = 0;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34ef,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34f0,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34f1,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  p_Var1 = (atlas->permanent).alloc;
  if (p_Var1 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34f2,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34f3,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_data == (void *)0x0) {
    __assert_fail("compressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34f5,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_size == 0) {
    __assert_fail("compressed_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34f6,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar2 = nk_decompress_length((uchar *)compressed_data);
  puVar4 = (uchar *)(*p_Var1)((atlas->permanent).userdata,(void *)0x0,(ulong)uVar2);
  if (puVar4 == (uchar *)0x0) {
    __assert_fail("decompressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x34fd,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar3 = *compressed_data;
  if (((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) !=
       0x57bc0000) ||
     (uVar3 = *(uint *)((long)compressed_data + 4),
     ((uVar3 >> 0x18 != 0 || (uVar3 & 0xff0000) != 0) || (uVar3 & 0xff00) != 0) ||
     (uVar3 & 0xff) != 0)) {
LAB_0012395a:
    if (config == (nk_font_config *)0x0) {
      nk_font_config(&local_88,height);
    }
    else {
      pnVar12 = &local_88;
      for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
        pnVar12->next = config->next;
        config = (nk_font_config *)((long)config + (ulong)bVar16 * -0x10 + 8);
        pnVar12 = (nk_font_config *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      }
    }
    local_88.ttf_data_owned_by_atlas = '\x01';
    local_88.ttf_blob = puVar4;
    local_88.ttf_size = (ulong)uVar2;
    local_88.size = height;
    pnVar5 = nk_font_atlas_add(atlas,&local_88);
    return pnVar5;
  }
  uVar3 = nk_decompress_length((uchar *)compressed_data);
  nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
  puVar15 = puVar4 + uVar3;
  puVar13 = (ushort *)((long)compressed_data + 0x10);
  nk__barrier2 = (uchar *)compressed_data;
  nk__barrier = puVar15;
  nk__barrier4 = puVar4;
  nk__dout = puVar4;
  do {
    bVar10 = (byte)*puVar13;
    uVar11 = (uint)bVar10;
    if (bVar10 < 0x20) {
      if (bVar10 < 0x18) {
        if (bVar10 < 0x10) {
          if (bVar10 < 8) {
            if (bVar10 != 4) {
              if (uVar11 == 6) {
                uVar9 = ~((ulong)*(byte *)((long)puVar13 + 3) |
                          (ulong)*(byte *)((long)puVar13 + 1) << 0x10 | (ulong)(byte)puVar13[1] << 8
                         );
                uVar11 = (uint)(byte)puVar13[2];
                goto LAB_00123a9c;
              }
              if (uVar11 == 7) {
                nk__lit((byte *)((long)puVar13 + 3),
                        (ushort)(*(ushort *)((long)puVar13 + 1) << 8 |
                                *(ushort *)((long)puVar13 + 1) >> 8) + 1);
                uVar9 = (ulong)(ushort)(*(ushort *)((long)puVar13 + 1) << 8 |
                                       *(ushort *)((long)puVar13 + 1) >> 8);
                lStack_a0 = 4;
                goto LAB_00123b10;
              }
              goto LAB_00123be6;
            }
            nk__match(nk__dout +
                      ~((ulong)*(byte *)((long)puVar13 + 3) |
                        (ulong)*(byte *)((long)puVar13 + 1) << 0x10 | (ulong)(byte)puVar13[1] << 8),
                      (ushort)(puVar13[2] << 8 | puVar13[2] >> 8) + 1);
            puVar14 = puVar13 + 3;
          }
          else {
            nk__lit((uchar *)(puVar13 + 1),
                    ((uint)bVar10 * 0x100 + (uint)*(byte *)((long)puVar13 + 1)) - 0x7ff);
            uVar9 = (ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
            lStack_a0 = -0x7fd;
LAB_00123b10:
            puVar14 = (ushort *)((long)puVar13 + uVar9 + lStack_a0);
            if (puVar14 == puVar13) {
              bVar10 = (byte)*puVar13;
LAB_00123be6:
              if ((bVar10 != 5) || (*(byte *)((long)puVar13 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                              ,0x33e7,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (nk__dout != puVar15) {
                __assert_fail("nk__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                              ,0x33e1,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              uVar9 = (ulong)uVar3 % 0x15b0;
              for (; uVar7 = 0xffffffffffffffff, uVar3 != 0; uVar3 = uVar3 - iVar8) {
                do {
                  uVar7 = uVar7 + 8;
                } while (uVar7 < uVar9);
                iVar8 = (int)uVar9;
                uVar9 = 0x15b0;
              }
              goto LAB_0012395a;
            }
          }
        }
        else {
          uVar9 = -(ulong)(((uint)*(byte *)((long)puVar13 + 1) * 0x100 +
                           ((uint)(byte)puVar13[1] | (uint)bVar10 << 0x10)) - 0xfffff);
          uVar11 = (uint)(ushort)(*(ushort *)((long)puVar13 + 3) << 8 |
                                 *(ushort *)((long)puVar13 + 3) >> 8);
LAB_00123a9c:
          nk__match(nk__dout + uVar9,uVar11 + 1);
          puVar14 = (ushort *)((long)puVar13 + 5);
        }
      }
      else {
        nk__match(nk__dout +
                  -(ulong)(((uint)*(byte *)((long)puVar13 + 1) * 0x100 +
                           ((uint)(byte)puVar13[1] | (uint)bVar10 << 0x10)) - 0x17ffff),
                  *(byte *)((long)puVar13 + 3) + 1);
        puVar14 = puVar13 + 2;
      }
    }
    else if ((char)bVar10 < '\0') {
      nk__match(nk__dout + ~(ulong)*(byte *)((long)puVar13 + 1),uVar11 - 0x7f);
      puVar14 = puVar13 + 1;
    }
    else {
      if (bVar10 < 0x40) {
        nk__lit((byte *)((long)puVar13 + 1),uVar11 - 0x1f);
        uVar9 = (ulong)(byte)*puVar13;
        lStack_a0 = -0x1e;
        goto LAB_00123b10;
      }
      nk__match(nk__dout +
                -(ulong)(((uint)*(byte *)((long)puVar13 + 1) + (uint)bVar10 * 0x100) - 0x3fff),
                (byte)puVar13[1] + 1);
      puVar14 = (ushort *)((long)puVar13 + 3);
    }
    puVar13 = puVar14;
    if (puVar15 < nk__dout) {
      __assert_fail("nk__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x33eb,
                    "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
    void *compressed_data, nk_size compressed_size, float height,
    const struct nk_font_config *config)
{
    unsigned int decompressed_size;
    void *decompressed_data;
    struct nk_font_config cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(compressed_data);
    NK_ASSERT(compressed_size);
    if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
    decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
    NK_ASSERT(decompressed_data);
    if (!decompressed_data) return 0;
    nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
        (unsigned int)compressed_size);

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = decompressed_data;
    cfg.ttf_size = decompressed_size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 1;
    return nk_font_atlas_add(atlas, &cfg);
}